

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::flagLookAheadStates(RBBITableBuilder *this)

{
  int32_t iVar1;
  void *obj;
  void *pvVar2;
  int index;
  int index_00;
  UVector lookAheadNodes;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    UVector::UVector(&lookAheadNodes,this->fStatus);
    RBBINode::findNodes(*this->fTree,&lookAheadNodes,lookAhead,this->fStatus);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      for (index = 0; index < lookAheadNodes.count; index = index + 1) {
        obj = UVector::elementAt(&lookAheadNodes,index);
        for (index_00 = 0; index_00 < this->fDStates->count; index_00 = index_00 + 1) {
          pvVar2 = UVector::elementAt(this->fDStates,index_00);
          iVar1 = UVector::indexOf(*(UVector **)((long)pvVar2 + 0x20),obj,0);
          if (-1 < iVar1) {
            *(undefined4 *)((long)pvVar2 + 8) = *(undefined4 *)((long)obj + 0x7c);
          }
        }
      }
    }
    UVector::~UVector(&lookAheadNodes);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagLookAheadStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     lookAheadNodes(*fStatus);
    RBBINode    *lookAheadNode;
    int32_t     i;
    int32_t     n;

    fTree->findNodes(&lookAheadNodes, RBBINode::lookAhead, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }
    for (i=0; i<lookAheadNodes.size(); i++) {
        lookAheadNode = (RBBINode *)lookAheadNodes.elementAt(i);

        for (n=0; n<fDStates->size(); n++) {
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(lookAheadNode) >= 0) {
                sd->fLookAhead = lookAheadNode->fVal;
            }
        }
    }
}